

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cones.h
# Opt level: O2

ConeArgs * __thiscall
mp::
Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::CheckNorm2_Pow<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>>
          (ConeArgs *__return_storage_ptr__,void *this,
          ConstraintLocationHelper<mp::BasicConstraintKeeper> *ci,int res_var)

{
  pair<int,_int> *ppVar1;
  int iVar2;
  int var;
  ptr ppVar3;
  size_ty sVar4;
  double *pdVar5;
  bool bVar6;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
  *pCVar7;
  ConInfo *ci_00;
  QuadraticFunctionalConstraint *pQVar8;
  long lVar9;
  long lVar10;
  int *piVar11;
  QuadTerms *this_00;
  double *c;
  double *pdVar12;
  double dVar13;
  ArrayRef<double> local_70;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  pCVar7 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
           ::
           GetConstraint<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::PowConstExpId>>
                     (*this,ci);
  dVar13 = (pCVar7->
           super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>
           ).params_._M_elems[0];
  if ((dVar13 == 0.5) && (!NAN(dVar13))) {
    var = (pCVar7->
          super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>
          ).args_._M_elems[0];
    bVar6 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::HasInitExpression(*this,var);
    if (bVar6) {
      ci_00 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::GetInitExpression(*this,var);
      if (((&(*this)->ck__QuadraticFunctionalConstraint_ ==
            (ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::QuadraticFunctionalConstraint>
             *)ci_00->pck_) &&
          (pQVar8 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    ::GetConstraint<mp::QuadraticFunctionalConstraint>(*this,ci_00),
          0.0 <= (pQVar8->quad_expr_).constant_term_)) &&
         (*(size_ty *)
           ((long)&(pQVar8->quad_expr_).super_QuadAndLinTerms.super_LinTerms.coefs_.
                   super_small_vector_base<std::allocator<double>,_6U>.m_data.
                   super_small_vector_data_base<double_*,_unsigned_long> + 0x10) == 0)) {
        this_00 = &(pQVar8->quad_expr_).super_QuadAndLinTerms.super_QuadTerms;
        ppVar3 = (pQVar8->quad_expr_).super_QuadAndLinTerms.super_QuadTerms.folded_.
                 super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                 .m_data.
                 super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                 .m_data_ptr;
        sVar4 = *(size_ty *)
                 ((long)&(pQVar8->quad_expr_).super_QuadAndLinTerms.super_QuadTerms.folded_.
                         super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                         .m_data.
                         super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                 + 0x10);
        lVar9 = sVar4 + 1;
        lVar10 = sVar4 << 0x20;
        piVar11 = &ppVar3[sVar4 - 1].first.second;
        do {
          lVar10 = lVar10 + -0x100000000;
          lVar9 = lVar9 + -1;
          if (lVar9 == 0) {
            __return_storage_ptr__->is_from_abs_ = false;
            (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            __return_storage_ptr__->const_term = 0.0;
            __return_storage_ptr__->coef_extra = 0.0;
            (__return_storage_ptr__->res_vars_to_delete_).
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
                 (pointer)0x0;
            (__return_storage_ptr__->res_vars_to_delete_).
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
                 = (pointer)0x0;
            (__return_storage_ptr__->res_vars_to_delete_).
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            QuadTerms::coefs(&local_70,this_00);
            ArrayRef<double>::move_or_copy
                      ((vector<double,_std::allocator<double>_> *)&local_48,&local_70);
            std::vector<double,_std::allocator<double>_>::_M_move_assign
                      (&__return_storage_ptr__->coefs_,&local_48);
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                      ((_Vector_base<double,_std::allocator<double>_> *)&local_70);
            pdVar5 = (__return_storage_ptr__->coefs_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (pdVar12 = (__return_storage_ptr__->coefs_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start; pdVar12 != pdVar5;
                pdVar12 = pdVar12 + 1) {
              dVar13 = *pdVar12;
              if (dVar13 < 0.0) {
                dVar13 = sqrt(dVar13);
              }
              else {
                dVar13 = SQRT(dVar13);
              }
              *pdVar12 = dVar13;
            }
            QuadTerms::vars1((ArrayRef<int> *)&local_70,this_00);
            ArrayRef<int>::move_or_copy
                      ((vector<int,_std::allocator<int>_> *)&local_48,(ArrayRef<int> *)&local_70);
            std::vector<int,_std::allocator<int>_>::_M_move_assign
                      (&__return_storage_ptr__->vars_,&local_48);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&local_48);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&local_70);
            __return_storage_ptr__->const_term = (pQVar8->quad_expr_).constant_term_;
            local_70.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = res_var;
            local_70.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ = var;
            std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                      ((vector<int,std::allocator<int>> *)
                       &__return_storage_ptr__->res_vars_to_delete_,&local_70,
                       (pointer *)
                       ((long)&local_70.save_.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data + 8));
            return __return_storage_ptr__;
          }
          pdVar12 = (double *)((long)&ppVar3->second + (lVar10 >> 0x1c));
        } while ((0.0 < *pdVar12 || *pdVar12 == 0.0) &&
                (ppVar1 = (pair<int,_int> *)(piVar11 + -1), iVar2 = *piVar11, piVar11 = piVar11 + -4
                , ppVar1->first == iVar2));
      }
    }
  }
  __return_storage_ptr__->is_from_abs_ = false;
  (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->const_term = 0.0;
  __return_storage_ptr__->coef_extra = 0.0;
  (__return_storage_ptr__->res_vars_to_delete_).super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->res_vars_to_delete_).super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->res_vars_to_delete_).super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

ConeArgs CheckNorm2_Pow(const ConInfo& ci, int res_var) {
    const auto& con_pow = MC().template
        GetConstraint<PowConstExpConstraint>(ci);
    const auto arg_pow = con_pow.GetArguments()[0];
    if (0.5 == con_pow.GetParameters()[0] &&     // sqrt(arg_pow)
        MC().HasInitExpression(arg_pow)) {
      const auto& ie_pow = MC().GetInitExpression(arg_pow);
      if (MC().template                          // arg_pow := QFC(...)
          IsConInfoType<QuadraticFunctionalConstraint>(ie_pow)) {
        const auto& con_qdc = MC().template
            GetConstraint<QuadraticFunctionalConstraint>(ie_pow);
        const auto& args_qdc = con_qdc.GetArguments();
        // Allowing a nonneg constant term by adding
        // an auxiliary variable^2
        if (0.0 <= args_qdc.constant_term() &&
            args_qdc.GetBody().GetLinTerms().empty()) {
          const auto& qpterms = args_qdc.GetBody().GetQPTerms();
          for (auto i=qpterms.size(); i--; ) {
            if (qpterms.coef(i) < 0.0 ||
                qpterms.var1(i) != qpterms.var2(i))
              return {};
          }
          ConeArgs result;
          result.coefs_ = qpterms.coefs();
          for (auto& c: result.coefs_)
            c = std::sqrt(c);
          result.vars_ = qpterms.vars1();
          result.const_term = args_qdc.constant_term();
          result.res_vars_to_delete_ = { res_var, arg_pow };
          return result;
        }
      }
    }
    return {};
  }